

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_environment_lookReturnTargetRecursively(sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  _Bool _Var1;
  sysbvm_tuple_t type;
  
  type = (context->roots).analysisAndEvaluationEnvironmentType;
  while( true ) {
    _Var1 = sysbvm_tuple_isKindOf(context,environment,type);
    if (!_Var1) {
      return 0;
    }
    if (*(sysbvm_tuple_t *)(environment + 0x60) != 0) break;
    environment = *(sysbvm_tuple_t *)(environment + 0x30);
    type = (context->roots).analysisAndEvaluationEnvironmentType;
  }
  return *(sysbvm_tuple_t *)(environment + 0x60);
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_lookReturnTargetRecursively(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        return SYSBVM_NULL_TUPLE;

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(environmentObject->returnTarget)
        return environmentObject->returnTarget;

    return sysbvm_environment_lookReturnTargetRecursively(context, environmentObject->super.parent);
}